

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AddPath
          (LocationRecorder *this,int path_component)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  uint uVar2;
  Location *pLVar3;
  int *piVar4;
  int tmp;
  
  pLVar3 = this->location_;
  this_00 = &pLVar3->path_;
  uVar1 = (pLVar3->path_).current_size_;
  uVar2 = (pLVar3->path_).total_size_;
  if (uVar1 == uVar2) {
    RepeatedField<int>::Reserve(this_00,uVar2 + 1);
  }
  piVar4 = RepeatedField<int>::elements(this_00);
  piVar4[uVar1] = path_component;
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

void Parser::LocationRecorder::AddPath(int path_component) {
  location_->add_path(path_component);
}